

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_node_init_iterator(art_node_t *node,art_iterator_t *iterator,_Bool first)

{
  _Bool _Var1;
  byte in_DL;
  art_iterator_t *in_RSI;
  art_node_t *in_RDI;
  art_indexed_child_t indexed_child;
  art_indexed_child_t in_stack_ffffffffffffffb8;
  art_indexed_child_t in_stack_ffffffffffffffc8;
  art_node_t *local_28;
  art_node_t *local_8;
  
  local_8 = in_RDI;
  while( true ) {
    _Var1 = art_is_leaf(local_8);
    if (((_Var1 ^ 0xffU) & 1) == 0) break;
    if ((in_DL & 1) == 0) {
      in_stack_ffffffffffffffb8 =
           art_node_prev_child(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8.child._4_4_
                              );
      local_28 = in_stack_ffffffffffffffb8.child;
    }
    else {
      in_stack_ffffffffffffffc8 =
           art_node_next_child(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8.child._4_4_
                              );
      local_28 = in_stack_ffffffffffffffc8.child;
    }
    art_iterator_down(in_stack_ffffffffffffffc8._8_8_,
                      (art_inner_node_t *)in_stack_ffffffffffffffc8.child,
                      in_stack_ffffffffffffffb8._15_1_);
    local_8 = local_28;
  }
  in_RSI->frames[in_RSI->frame].node = local_8;
  in_RSI->frames[in_RSI->frame].index_in_node = '\0';
  _Var1 = art_iterator_valid_loc(in_RSI,(art_leaf_t *)((ulong)local_8 & 0xfffffffffffffffe));
  return _Var1;
}

Assistant:

static bool art_node_init_iterator(const art_node_t *node,
                                   art_iterator_t *iterator, bool first) {
    while (!art_is_leaf(node)) {
        art_indexed_child_t indexed_child;
        if (first) {
            indexed_child = art_node_next_child(node, -1);
        } else {
            indexed_child = art_node_prev_child(node, 256);
        }
        art_iterator_down(iterator, (art_inner_node_t *)node,
                          indexed_child.index);
        node = indexed_child.child;
    }
    // We're at a leaf.
    iterator->frames[iterator->frame].node = (art_node_t *)node;
    iterator->frames[iterator->frame].index_in_node = 0;  // Should not matter.
    return art_iterator_valid_loc(iterator, CAST_LEAF(node));
}